

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O0

void __thiscall Api::startGame(Api *this)

{
  allocator local_31;
  string local_30 [32];
  Api *local_10;
  Api *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"tst",&local_31);
  initFromFile(this,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  GameManager::shuffleDecks(&this->_game);
  GameManager::start(&this->_game);
  return;
}

Assistant:

void Api::startGame() {
    this->initFromFile("tst");
    this->_game.shuffleDecks();
    this->_game.start();
}